

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationBasicSemaphoreTests.cpp
# Opt level: O1

TestCaseGroup * vkt::synchronization::createBasicSemaphoreTests(TestContext *testCtx)

{
  TestContext *pTVar1;
  TestNode *this;
  TestNode *pTVar2;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  this = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this,testCtx,"semaphore","Basic semaphore tests");
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"one_queue","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,"Basic semaphore tests with one queue","");
  pTVar1 = this->m_testCtx;
  pTVar2 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pTVar1,NODETYPE_SELF_VALIDATE,(char *)local_50[0],
             (char *)local_70[0]);
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d1b480;
  pTVar2[1].m_testCtx = (TestContext *)anon_unknown_0::basicOneQueueCase;
  tcu::TestNode::addChild(this,pTVar2);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"multi_queue","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,"Basic semaphore tests with multi queue","");
  pTVar1 = this->m_testCtx;
  pTVar2 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pTVar1,NODETYPE_SELF_VALIDATE,(char *)local_50[0],
             (char *)local_70[0]);
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d1b480;
  pTVar2[1].m_testCtx = (TestContext *)anon_unknown_0::basicMultiQueueCase;
  tcu::TestNode::addChild(this,pTVar2);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return (TestCaseGroup *)this;
}

Assistant:

tcu::TestCaseGroup* createBasicSemaphoreTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> basicTests(new tcu::TestCaseGroup(testCtx, "semaphore", "Basic semaphore tests"));
	addFunctionCase(basicTests.get(), "one_queue",   "Basic semaphore tests with one queue",   basicOneQueueCase);
	addFunctionCase(basicTests.get(), "multi_queue", "Basic semaphore tests with multi queue", basicMultiQueueCase);

	return basicTests.release();
}